

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O1

bool __thiscall
iDynTree::ConvexHullProjectionConstraint::buildConvexHull
          (ConvexHullProjectionConstraint *this,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
          *supportPolygonsExpressedInSupportFrame,
          vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
          *absoluteFrame_X_supportFrame)

{
  Polygon2D *this_00;
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  pointer pVVar4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  iterator iVar8;
  pointer pPVar9;
  VectorFixSize<2U> *pVVar10;
  ulong uVar11;
  pointer pPVar12;
  pointer pPVar13;
  double dVar14;
  double dVar15;
  uint uVar16;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *pvVar17;
  ulong uVar18;
  PointerType ptr_2;
  PointerType ptr;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  double *pdVar22;
  PointerType ptr_1;
  ulong uVar23;
  __normal_iterator<iDynTree::VectorFixSize<2U>_*,_std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>_>
  __i;
  long lVar24;
  VectorFixSize<2U> *pVVar25;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> projectedPoints
  ;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
  supportPolygonsExpressedInAbsoluteFrame;
  assign_op<double,_double> local_d9;
  VectorFixSize<2U> *local_d8;
  iterator iStack_d0;
  VectorFixSize<2U> *local_c8;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *local_c0;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> local_b8;
  undefined1 local_98 [56];
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *local_60;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_58;
  
  local_c0 = absoluteFrame_X_supportFrame;
  iDynTree::Position::operator=(&this->o,originOfPlaneInWorld);
  uVar7 = *(undefined8 *)(xAxisOfPlaneInWorld + 8);
  *(undefined8 *)&this->P = *(undefined8 *)xAxisOfPlaneInWorld;
  *(undefined8 *)&this->field_0x70 = uVar7;
  *(undefined8 *)&this->field_0x78 = *(undefined8 *)(xAxisOfPlaneInWorld + 0x10);
  uVar7 = *(undefined8 *)(yAxisOfPlaneInWorld + 8);
  *(undefined8 *)&this->field_0x80 = *(undefined8 *)yAxisOfPlaneInWorld;
  *(undefined8 *)&this->field_0x88 = uVar7;
  *(undefined8 *)&this->field_0x90 = *(undefined8 *)(yAxisOfPlaneInWorld + 0x10);
  local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::resize
            (&local_b8,
             ((long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pPVar9 = (supportPolygonsExpressedInSupportFrame->
           super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_60 = supportPolygonsExpressedInSupportFrame;
  if ((supportPolygonsExpressedInSupportFrame->
      super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar9) {
    lVar19 = 0;
    lVar24 = 0;
    uVar23 = 0;
    do {
      Polygon::applyTransform
                ((Polygon *)local_98,
                 (Polygon *)
                 ((long)&(pPVar9->m_vertices).
                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar24),
                 (Transform *)(*(long *)local_c0 + lVar19));
      std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::_M_move_assign
                ((vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
                 ((long)&((local_b8.
                           super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_vertices).
                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar24),(Polygon *)local_98);
      if ((pointer)local_98._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
      }
      uVar23 = uVar23 + 1;
      pPVar9 = (local_60->super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      lVar24 = lVar24 + 0x18;
      lVar19 = lVar19 + 0x60;
    } while (uVar23 < (ulong)(((long)(local_60->
                                     super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >> 3
                              ) * -0x5555555555555555));
  }
  local_d8 = (VectorFixSize<2U> *)0x0;
  iStack_d0._M_current = (VectorFixSize<2U> *)0x0;
  local_c8 = (VectorFixSize<2U> *)0x0;
  if (local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pvVar17 = (vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)0x0;
    do {
      local_c0 = pvVar17;
      if (local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl
          .super__Vector_impl_data._M_start[(long)pvVar17].m_vertices.
          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl
          .super__Vector_impl_data._M_start[(long)pvVar17].m_vertices.
          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pPVar9 = local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                 _M_impl.super__Vector_impl_data._M_start + (long)pvVar17;
        lVar19 = 0;
        uVar23 = 0;
        do {
          iDynTree::Position::operator-
                    ((Position *)local_98,
                     (pPVar9->m_vertices).
                     super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar19);
          dVar14 = (double)local_98._16_8_ * *(double *)&this->field_0x78 +
                   *(double *)&this->field_0x70 * (double)local_98._8_8_ +
                   *(double *)&this->P * (double)local_98._0_8_;
          dVar15 = (double)local_98._16_8_ * *(double *)&this->field_0x90 +
                   *(double *)&this->field_0x88 * (double)local_98._8_8_ +
                   *(double *)&this->field_0x80 * (double)local_98._0_8_;
          local_58.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value._0_4_ = SUB84(dVar15,0);
          local_58.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = (PointerType)dVar14;
          local_58.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value._4_4_ = (int)((ulong)dVar15 >> 0x20);
          if (iStack_d0._M_current == local_c8) {
            std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>::
            _M_realloc_insert<iDynTree::VectorFixSize<2u>const&>
                      ((vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>
                        *)&local_d8,iStack_d0,(VectorFixSize<2U> *)&local_58);
          }
          else {
            (iStack_d0._M_current)->m_data[0] = dVar14;
            (iStack_d0._M_current)->m_data[1] =
                 (double)local_58.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_rows.m_value;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
          uVar23 = uVar23 + 1;
          pPVar9 = local_b8.
                   super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl
                   .super__Vector_impl_data._M_start + (long)pvVar17;
          lVar19 = lVar19 + 0x18;
        } while (uVar23 < (ulong)(((long)(pPVar9->m_vertices).
                                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pPVar9->m_vertices).
                                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      pvVar17 = local_c0 + 1;
    } while (pvVar17 < (vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
                       (((long)local_b8.
                               super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_b8.
                               super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ));
  }
  iVar8._M_current = (VectorFixSize<2U> *)iStack_d0;
  pVVar10 = local_d8;
  lVar19 = (long)iStack_d0._M_current - (long)local_d8;
  uVar23 = lVar19 >> 4;
  if (2 < uVar23) {
    if (local_d8 != iStack_d0._M_current) {
      lVar24 = 0x3f;
      if (uVar23 != 0) {
        for (; uVar23 >> lVar24 == 0; lVar24 = lVar24 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                (local_d8,iStack_d0._M_current,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
      if (0x100 < lVar19) {
        pVVar25 = pVVar10 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                  (pVVar10,pVVar25);
LAB_00107c98:
        if (pVVar25 != iVar8._M_current) {
          dVar14 = pVVar25->m_data[0];
          dVar15 = pVVar25->m_data[1];
          pVVar10 = pVVar25;
          do {
            dVar3 = pVVar10[-1].m_data[0];
            if (dVar3 <= dVar14) {
              if (((dVar14 != dVar3) || (NAN(dVar14) || NAN(dVar3))) ||
                 (pVVar10[-1].m_data[1] <= dVar15)) goto LAB_00107cdc;
            }
            dVar3 = pVVar10[-1].m_data[1];
            pVVar10->m_data[0] = pVVar10[-1].m_data[0];
            pVVar10->m_data[1] = dVar3;
            pVVar10 = pVVar10 + -1;
          } while( true );
        }
        goto LAB_00107cf1;
      }
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                (pVVar10,iVar8._M_current);
    }
LAB_00107cf1:
    this_00 = &this->projectedConvexHull;
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              (&this_00->m_vertices,(long)iStack_d0._M_current - (long)local_d8 >> 3);
    if (iStack_d0._M_current == local_d8) {
      uVar18 = 0;
      uVar21 = 0;
    }
    else {
      uVar11 = 0;
      uVar21 = 0;
      do {
        pdVar22 = (this_00->m_vertices).
                  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar21 - 1].m_data + 1;
        uVar18 = uVar21;
        do {
          uVar20 = (ulong)(uVar21 != 0);
          if (uVar18 < 2) break;
          pdVar1 = pdVar22 + -3;
          pdVar2 = pdVar22 + -2;
          pVVar10 = (VectorFixSize<2U> *)(pdVar22 + -1);
          dVar14 = *pdVar22;
          pdVar22 = pdVar22 + -2;
          uVar20 = uVar18;
          uVar18 = uVar18 - 1;
        } while ((local_d8[uVar11].m_data[1] - *pdVar2) * (pVVar10->m_data[0] - *pdVar1) -
                 (local_d8[uVar11].m_data[0] - *pdVar1) * (dVar14 - *pdVar2) <= 0.0);
        dVar14 = local_d8[uVar11].m_data[1];
        pVVar4 = (this_00->m_vertices).
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar20;
        pVVar4->m_data[0] = local_d8[uVar11].m_data[0];
        pVVar4->m_data[1] = dVar14;
        uVar21 = uVar20 + 1;
        uVar11 = uVar11 + 1;
        uVar18 = (long)iStack_d0._M_current - (long)local_d8 >> 4;
      } while (uVar11 < uVar18);
    }
    uVar16 = (int)uVar18 - 2;
    if (-1 < (int)uVar16) {
      iVar6 = (int)uVar21;
      uVar18 = (ulong)uVar16;
      do {
        pVVar4 = (this_00->m_vertices).
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = uVar21 << 4;
        do {
          lVar24 = lVar19;
          uVar11 = uVar21;
          if (uVar11 < (ulong)(long)(iVar6 + 1)) break;
          dVar14 = *(double *)((long)pVVar4[-2].m_data + lVar24);
          dVar15 = *(double *)((long)pVVar4->m_data + lVar24 + -0x18);
          uVar21 = uVar11 - 1;
          lVar19 = lVar24 + -0x10;
        } while ((local_d8[uVar18].m_data[1] - dVar15) *
                 (*(double *)((long)pVVar4[-1].m_data + lVar24) - dVar14) -
                 (local_d8[uVar18].m_data[0] - dVar14) *
                 (*(double *)((long)pVVar4->m_data + lVar24 + -8) - dVar15) <= 0.0);
        dVar14 = local_d8[uVar18].m_data[1];
        pdVar22 = (double *)
                  ((long)((this_00->m_vertices).
                          super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar24);
        *pdVar22 = local_d8[uVar18].m_data[0];
        pdVar22[1] = dVar14;
        uVar21 = uVar11 + 1;
        bVar5 = 0 < (long)uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar5);
      uVar21 = uVar11 + 1;
    }
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              (&this_00->m_vertices,uVar21 - 1);
    buildConstraintMatrix(this);
    uVar21 = iDynTree::MatrixDynSize::rows();
    iDynTree::MatrixDynSize::resize((ulong)&this->AtimesP,uVar21);
    pPVar12 = (pointer)iDynTree::MatrixDynSize::data();
    pPVar13 = (pointer)iDynTree::MatrixDynSize::rows();
    local_98._16_8_ = iDynTree::MatrixDynSize::cols();
    local_98._32_8_ = &this->P;
    local_98._0_8_ = pPVar12;
    local_98._8_8_ = pPVar13;
    dVar14 = (double)iDynTree::MatrixDynSize::data();
    dVar15 = (double)iDynTree::MatrixDynSize::rows();
    local_58.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = iDynTree::MatrixDynSize::cols();
    local_58.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)dVar15;
    local_58.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = (PointerType)dVar14;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
              (&local_58,
               (Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)local_98,&local_d9,(type)0x0);
  }
  if (local_d8 != (VectorFixSize<2U> *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector(&local_b8);
  return 2 < uVar23;
LAB_00107cdc:
  pVVar10->m_data[0] = dVar14;
  pVVar10->m_data[1] = dVar15;
  pVVar25 = pVVar25 + 1;
  goto LAB_00107c98;
}

Assistant:

bool ConvexHullProjectionConstraint::buildConvexHull(const iDynTree::Direction xAxisOfPlaneInWorld,
                                                         const iDynTree::Direction yAxisOfPlaneInWorld,
                                                         const iDynTree::Position originOfPlaneInWorld,
                                                         const std::vector<Polygon> &supportPolygonsExpressedInSupportFrame,
                                                         const std::vector<Transform> &absoluteFrame_X_supportFrame)
    {
        o = originOfPlaneInWorld;
        toEigen(P).block<1, 3>(0,0) = toEigen(xAxisOfPlaneInWorld);
        toEigen(P).block<1, 3>(1,0) = toEigen(yAxisOfPlaneInWorld);

        // Transform the polygons in the absolute frame
        std::vector<Polygon> supportPolygonsExpressedInAbsoluteFrame;

        supportPolygonsExpressedInAbsoluteFrame.resize(supportPolygonsExpressedInSupportFrame.size());

        for(size_t i=0; i< supportPolygonsExpressedInSupportFrame.size(); i++)
        {
            supportPolygonsExpressedInAbsoluteFrame[i] = supportPolygonsExpressedInSupportFrame[i].applyTransform(absoluteFrame_X_supportFrame[i]);
        }

        // Project the polygons on the projection plane
        std::vector<Vector2> projectedPoints;

        for(size_t poly=0; poly < supportPolygonsExpressedInAbsoluteFrame.size(); poly++)
        {
            for(size_t vertex=0; vertex < supportPolygonsExpressedInAbsoluteFrame[poly].getNrOfVertices(); vertex++)
            {
                 Vector2 newProjectedPoint = project(supportPolygonsExpressedInAbsoluteFrame[poly](vertex));
                 //toEigen(newProjectedPoint) = toEigen(P)*toEigen(supportPolygonsExpressedInAbsoluteFrame[poly](vertex)-o);
                 projectedPoints.push_back(newProjectedPoint);
            }
        }

        if (projectedPoints.size() <= 2)
        {
            return false;
        }

        // Compute the convex hull using the Monotone Chain

        // Order the projected points with a lexographical ordering
        struct
        {
            bool operator()(Vector2 a, Vector2 b)
            {
                return (a(0) < b(0)) || ( (a(0) == b(0)) && (a(1) < b(1)) );
            }
        } vector2lexographical;

        std::sort(projectedPoints.begin(), projectedPoints.end(), vector2lexographical);

        // Reset the convex hull (it will be properly resized after running the algorithm
        projectedConvexHull.m_vertices.resize(2*projectedPoints.size());
        size_t k = 0;

        // Build the upper hull
        for (int i = 0; i < projectedPoints.size(); ++i)
        {
            while (k >= 2 && monotono_chain_cross(projectedConvexHull.m_vertices[k-2],
                                                  projectedConvexHull.m_vertices[k-1],
                                                  projectedPoints[i]) <= 0)
            {
                k = k-1;
            }

            projectedConvexHull.m_vertices[k] = projectedPoints[i];
            k = k+1;

        }

        // Build the lower hull
        for (int i = projectedPoints.size()-2, t = k+1; i >= 0; i--)
        {
            while (k >= t && monotono_chain_cross(projectedConvexHull.m_vertices[k-2],
                                                  projectedConvexHull.m_vertices[k-1],
                                                  projectedPoints[i]) <= 0)
            {
                k = k-1;
            }

            projectedConvexHull.m_vertices[k] = projectedPoints[i];
            k = k+1;
        }

        projectedConvexHull.m_vertices.resize(k-1);

        // Build the constraint matrix
        buildConstraintMatrix();

        // Update AtimesP matrix
        AtimesP.resize(A.rows(),P.cols());

        toEigen(AtimesP) = toEigen(A)*toEigen(P);

        return true;
    }